

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O3

asn_enc_rval_t *
INTEGER_encode_der(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,
                  int tag_mode,ber_tlv_tag_t tag,asn_app_consume_bytes_f *cb,void *app_key)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  
  pcVar3 = *sptr;
  if (pcVar3 != (char *)0x0) {
    iVar5 = *(int *)((long)sptr + 8);
    pcVar4 = pcVar3;
    if (pcVar3 < pcVar3 + (long)iVar5 + -1) {
      cVar1 = *pcVar3;
      lVar7 = (long)iVar5 + -1;
      pcVar6 = pcVar3;
      do {
        pcVar4 = pcVar6;
        if (cVar1 == -1) {
          cVar1 = pcVar4[1];
          if (-1 < cVar1) break;
        }
        else if ((cVar1 != '\0') || (cVar1 = pcVar4[1], cVar1 < '\0')) break;
        pcVar6 = pcVar4 + 1;
        lVar7 = lVar7 + -1;
        pcVar4 = pcVar3 + (long)iVar5 + -1;
      } while (lVar7 != 0);
    }
    iVar2 = (int)pcVar4 - (int)pcVar3;
    if (iVar2 != 0) {
      iVar5 = iVar5 - iVar2;
      *(int *)((long)sptr + 8) = iVar5;
      if (0 < iVar5) {
        pcVar6 = pcVar3 + iVar5;
        do {
          *pcVar3 = *pcVar4;
          pcVar3 = pcVar3 + 1;
          pcVar4 = pcVar4 + 1;
        } while (pcVar3 < pcVar6);
      }
    }
  }
  der_encode_primitive(__return_storage_ptr__,td,sptr,tag_mode,tag,cb,app_key);
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
INTEGER_encode_der(asn_TYPE_descriptor_t *td, void *sptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	INTEGER_t *st = (INTEGER_t *)sptr;

	ASN_DEBUG("%s %s as INTEGER (tm=%d)",
		cb?"Encoding":"Estimating", td->name, tag_mode);

	/*
	 * Canonicalize integer in the buffer.
	 * (Remove too long sign extension, remove some first 0x00 bytes)
	 */
	if(st->buf) {
		uint8_t *buf = st->buf;
		uint8_t *end1 = buf + st->size - 1;
		int shift;

		/* Compute the number of superfluous leading bytes */
		for(; buf < end1; buf++) {
			/*
			 * If the contents octets of an integer value encoding
			 * consist of more than one octet, then the bits of the
			 * first octet and bit 8 of the second octet:
			 * a) shall not all be ones; and
			 * b) shall not all be zero.
			 */
			switch(*buf) {
			case 0x00: if((buf[1] & 0x80) == 0)
					continue;
				break;
			case 0xff: if((buf[1] & 0x80))
					continue;
				break;
			}
			break;
		}

		/* Remove leading superfluous bytes from the integer */
		shift = buf - st->buf;
		if(shift) {
			uint8_t *nb = st->buf;
			uint8_t *end;

			st->size -= shift;	/* New size, minus bad bytes */
			end = nb + st->size;

			for(; nb < end; nb++, buf++)
				*nb = *buf;
		}

	} /* if(1) */

	return der_encode_primitive(td, sptr, tag_mode, tag, cb, app_key);
}